

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O0

int dorevert(void)

{
  undo_rec *rec_00;
  int iVar1;
  int iVar2;
  int *piVar3;
  undo_rec *rec;
  int lineno;
  
  iVar1 = access(curbp->b_fname,4);
  if (iVar1 == 0) {
    iVar1 = curwp->w_dotline;
    curbp->b_flag = curbp->b_flag & 0xfe;
    while (rec_00 = (curbp->b_undo).tqh_first, rec_00 != (undo_rec *)0x0) {
      if ((rec_00->next).tqe_next == (undo_rec *)0x0) {
        (curbp->b_undo).tqh_last = (rec_00->next).tqe_prev;
      }
      else {
        (((rec_00->next).tqe_next)->next).tqe_prev = (rec_00->next).tqe_prev;
      }
      *(rec_00->next).tqe_prev = (rec_00->next).tqe_next;
      free_undo_record(rec_00);
    }
    iVar2 = readin(curbp->b_fname);
    if (iVar2 == 0) {
      rec._4_4_ = 0;
    }
    else {
      rec._4_4_ = setlineno(iVar1);
    }
  }
  else {
    dobeep();
    piVar3 = __errno_location();
    if (*piVar3 == 2) {
      ewprintf("File %s no longer exists!",curbp->b_fname);
    }
    else {
      ewprintf("File %s is no longer readable!",curbp->b_fname);
    }
    rec._4_4_ = 0;
  }
  return rec._4_4_;
}

Assistant:

int
dorevert(void)
{
	int lineno;
	struct undo_rec *rec;

	if (access(curbp->b_fname, F_OK|R_OK) != 0) {
		dobeep();
		if (errno == ENOENT)
			ewprintf("File %s no longer exists!",
			    curbp->b_fname);
		else
			ewprintf("File %s is no longer readable!",
			    curbp->b_fname);
		return (FALSE);
	}

	/* Save our current line, so we can go back after reloading. */
	lineno = curwp->w_dotline;

	/* Prevent readin from asking if we want to kill the buffer. */
	curbp->b_flag &= ~BFCHG;

	/* Clean up undo memory */
	while ((rec = TAILQ_FIRST(&curbp->b_undo))) {
		TAILQ_REMOVE(&curbp->b_undo, rec, next);
		free_undo_record(rec);
	}

	if (readin(curbp->b_fname))
		return(setlineno(lineno));
	return (FALSE);
}